

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  long in_RSI;
  int in_EDI;
  char test [64];
  int pi;
  int c;
  int t;
  int i;
  int in_stack_000007c4;
  int in_stack_00000804;
  ulong in_stack_ffffffffffffff90;
  char local_68 [12];
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd4;
  int local_18;
  int local_14;
  int local_4;
  
  memset(local_68,0,0x40);
  if (in_EDI < 2) {
    strcat(local_68,"0123456789");
  }
  else {
    local_18 = 0;
    local_14 = 0;
    while( true ) {
      in_stack_ffffffffffffff90 = (ulong)local_14;
      sVar3 = strlen(*(char **)(in_RSI + 8));
      if (sVar3 <= in_stack_ffffffffffffff90) break;
      iVar1 = tolower((int)*(char *)(*(long *)(in_RSI + 8) + (long)local_14));
      pcVar4 = strchr(local_68,iVar1);
      if (pcVar4 == (char *)0x0) {
        local_68[local_18] = (char)iVar1;
        local_68[local_18 + 1] = '\0';
        local_18 = local_18 + 1;
      }
      local_14 = local_14 + 1;
    }
  }
  iVar1 = (int)(in_stack_ffffffffffffff90 >> 0x20);
  uVar2 = pigpio_start(0);
  if ((int)uVar2 < 0) {
    fprintf(_stderr,"pigpio initialisation failed (%d).\n",(ulong)uVar2);
    local_4 = 1;
  }
  else {
    printf("Connected to pigpio daemon (%d).\n",(ulong)uVar2);
    pcVar4 = strchr(local_68,0x30);
    if (pcVar4 != (char *)0x0) {
      t0(0);
    }
    pcVar4 = strchr(local_68,0x31);
    if (pcVar4 != (char *)0x0) {
      t1(0);
    }
    pcVar4 = strchr(local_68,0x32);
    if (pcVar4 != (char *)0x0) {
      t2(in_stack_ffffffffffffffa4);
    }
    pcVar4 = strchr(local_68,0x33);
    if (pcVar4 != (char *)0x0) {
      t3(in_stack_ffffffffffffffc4);
    }
    pcVar4 = strchr(local_68,0x34);
    if (pcVar4 != (char *)0x0) {
      t4(in_stack_ffffffffffffffd4);
    }
    pcVar4 = strchr(local_68,0x35);
    if (pcVar4 != (char *)0x0) {
      t5(in_stack_00000804);
    }
    pcVar4 = strchr(local_68,0x36);
    if (pcVar4 != (char *)0x0) {
      t6(iVar1);
    }
    pcVar4 = strchr(local_68,0x37);
    if (pcVar4 != (char *)0x0) {
      t7(iVar1);
    }
    pcVar4 = strchr(local_68,0x38);
    if (pcVar4 != (char *)0x0) {
      t8(0);
    }
    pcVar4 = strchr(local_68,0x39);
    if (pcVar4 != (char *)0x0) {
      t9(in_stack_ffffffffffffffd4);
    }
    pcVar4 = strchr(local_68,0x61);
    if (pcVar4 != (char *)0x0) {
      ta(in_stack_000007c4);
    }
    pcVar4 = strchr(local_68,0x62);
    if (pcVar4 != (char *)0x0) {
      tb(test._20_4_);
    }
    pcVar4 = strchr(local_68,99);
    if (pcVar4 != (char *)0x0) {
      tc(test._4_4_);
    }
    pigpio_stop(uVar2);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
   int i, t, c, pi;

   char test[64]={0,};

   if (argc > 1)
   {
      t = 0;

      for (i=0; i<strlen(argv[1]); i++)
      {
         c = tolower(argv[1][i]);

         if (!strchr(test, c))
         {
            test[t++] = c;
            test[t] = 0;
         }
      }
   }
   else strcat(test, "0123456789");

   pi = pigpio_start(0, 0);

   if (pi < 0)
   {
      fprintf(stderr, "pigpio initialisation failed (%d).\n", pi);
      return 1;
   }

   printf("Connected to pigpio daemon (%d).\n", pi);

   if (strchr(test, '0')) t0(pi);
   if (strchr(test, '1')) t1(pi);
   if (strchr(test, '2')) t2(pi);
   if (strchr(test, '3')) t3(pi);
   if (strchr(test, '4')) t4(pi);
   if (strchr(test, '5')) t5(pi);
   if (strchr(test, '6')) t6(pi);
   if (strchr(test, '7')) t7(pi);
   if (strchr(test, '8')) t8(pi);
   if (strchr(test, '9')) t9(pi);
   if (strchr(test, 'a')) ta(pi);
   if (strchr(test, 'b')) tb(pi);
   if (strchr(test, 'c')) tc(pi);

   pigpio_stop(pi);

   return 0;
}